

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_add_custom_headers(Curl_easy *data,_Bool is_connect,int httpversion,dynbuf *req)

{
  _Bool _Var1;
  int iVar2;
  void *pvVar3;
  char cVar4;
  undefined1 local_88 [8];
  Curl_str val;
  char *origp;
  char *p;
  Curl_str name;
  CURLcode local_50;
  _Bool blankheader;
  CURLcode result;
  Curl_proxy_use proxy;
  int i;
  int numlists;
  curl_slist *headers;
  curl_slist *h [2];
  dynbuf *req_local;
  int httpversion_local;
  _Bool is_connect_local;
  Curl_easy *data_local;
  
  h[1] = (curl_slist *)req;
  proxy = HEADER_PROXY;
  if (is_connect) {
    cVar4 = '\x02';
  }
  else {
    cVar4 = '\0';
    if (((ulong)data->conn->bits & 1) != 0) {
      cVar4 = ((ulong)data->conn->bits >> 3 & 1) == 0;
    }
  }
  if (((cVar4 != '\0') && (cVar4 == '\x01')) && ((*(ulong *)&(data->set).field_0x89c >> 6 & 1) != 0)
     ) {
    h[0] = (data->set).proxyheaders;
    proxy = HEADER_CONNECT;
  }
  result = CURLE_OK;
  do {
    if ((int)proxy <= (int)result) {
      return CURLE_OK;
    }
    for (_i = h[(long)(int)result + -1]; _i != (curl_slist *)0x0; _i = _i->next) {
      local_50 = CURLE_OK;
      name.len._7_1_ = 0;
      val.len = (size_t)_i->data;
      origp = (char *)val.len;
      iVar2 = Curl_str_until(&origp,(Curl_str *)&p,0x4b000,';');
      if (((iVar2 == 0) && (iVar2 = Curl_str_single(&origp,';'), iVar2 == 0)) &&
         ((iVar2 = Curl_str_single(&origp,'\0'), iVar2 == 0 &&
          (pvVar3 = memchr(p,0x3a,(size_t)name.str), pvVar3 == (void *)0x0)))) {
        name.len._7_1_ = 1;
LAB_00150cb6:
        if (((((((data->state).aptr.host == (char *)0x0) ||
               (iVar2 = Curl_str_casecompare((Curl_str *)&p,"Host"), iVar2 == 0)) &&
              (((data->state).httpreq != '\x02' ||
               (iVar2 = Curl_str_casecompare((Curl_str *)&p,"Content-Type"), iVar2 == 0)))) &&
             (((data->state).httpreq != '\x03' ||
              (iVar2 = Curl_str_casecompare((Curl_str *)&p,"Content-Type"), iVar2 == 0)))) &&
            (((*(uint *)&(data->req).field_0xd1 >> 0x12 & 1) == 0 ||
             (iVar2 = Curl_str_casecompare((Curl_str *)&p,"Content-Length"), iVar2 == 0)))) &&
           (((((data->state).aptr.te == (char *)0x0 ||
              (iVar2 = Curl_str_casecompare((Curl_str *)&p,"Connection"), iVar2 == 0)) &&
             ((httpversion < 0x14 ||
              (iVar2 = Curl_str_casecompare((Curl_str *)&p,"Transfer-Encoding"), iVar2 == 0)))) &&
            (((iVar2 = Curl_str_casecompare((Curl_str *)&p,"Authorization"), iVar2 == 0 &&
              (iVar2 = Curl_str_casecompare((Curl_str *)&p,"Cookie"), iVar2 == 0)) ||
             (_Var1 = Curl_auth_allowed_to_host(data), _Var1)))))) {
          if ((name.len._7_1_ & 1) == 0) {
            local_50 = Curl_dyn_addf((dynbuf *)h[1],"%s\r\n",val.len);
          }
          else {
            local_50 = Curl_dyn_addf((dynbuf *)h[1],"%.*s:\r\n",(ulong)name.str & 0xffffffff,p);
          }
        }
        if (local_50 != CURLE_OK) {
          return local_50;
        }
      }
      else {
        origp = (char *)val.len;
        iVar2 = Curl_str_until(&origp,(Curl_str *)&p,0x4b000,':');
        if ((iVar2 == 0) && (iVar2 = Curl_str_single(&origp,':'), iVar2 == 0)) {
          Curl_str_untilnl(&origp,(Curl_str *)local_88,0x4b000);
          Curl_str_trimblanks((Curl_str *)local_88);
          if (val.str != (char *)0x0) goto LAB_00150cb6;
        }
      }
    }
    result = result + CURLE_UNSUPPORTED_PROTOCOL;
  } while( true );
}

Assistant:

CURLcode Curl_add_custom_headers(struct Curl_easy *data,
                                 bool is_connect, int httpversion,
                                 struct dynbuf *req)
{
  struct curl_slist *h[2];
  struct curl_slist *headers;
  int numlists = 1; /* by default */
  int i;

#ifndef CURL_DISABLE_PROXY
  enum Curl_proxy_use proxy;

  if(is_connect)
    proxy = HEADER_CONNECT;
  else
    proxy = data->conn->bits.httpproxy && !data->conn->bits.tunnel_proxy ?
      HEADER_PROXY : HEADER_SERVER;

  switch(proxy) {
  case HEADER_SERVER:
    h[0] = data->set.headers;
    break;
  case HEADER_PROXY:
    h[0] = data->set.headers;
    if(data->set.sep_headers) {
      h[1] = data->set.proxyheaders;
      numlists++;
    }
    break;
  case HEADER_CONNECT:
    if(data->set.sep_headers)
      h[0] = data->set.proxyheaders;
    else
      h[0] = data->set.headers;
    break;
  }
#else
  (void)is_connect;
  h[0] = data->set.headers;
#endif

  /* loop through one or two lists */
  for(i = 0; i < numlists; i++) {
    for(headers = h[i]; headers; headers = headers->next) {
      CURLcode result = CURLE_OK;
      bool blankheader = FALSE;
      struct Curl_str name;
      const char *p = headers->data;
      const char *origp = p;

      /* explicitly asked to send header without content is done by a header
         that ends with a semicolon, but there must be no colon present in the
         name */
      if(!Curl_str_until(&p, &name, MAX_HTTP_RESP_HEADER_SIZE, ';') &&
         !Curl_str_single(&p, ';') &&
         !Curl_str_single(&p, '\0') &&
         !memchr(Curl_str(&name), ':', Curl_strlen(&name)))
        blankheader = TRUE;
      else {
        p = origp;
        if(!Curl_str_until(&p, &name, MAX_HTTP_RESP_HEADER_SIZE, ':') &&
           !Curl_str_single(&p, ':')) {
          struct Curl_str val;
          Curl_str_untilnl(&p, &val, MAX_HTTP_RESP_HEADER_SIZE);
          Curl_str_trimblanks(&val);
          if(!Curl_strlen(&val))
            /* no content, don't send this */
            continue;
        }
        else
          /* no colon */
          continue;
      }

      /* only send this if the contents was non-blank or done special */

      if(data->state.aptr.host &&
         /* a Host: header was sent already, do not pass on any custom
            Host: header as that will produce *two* in the same
            request! */
         Curl_str_casecompare(&name, "Host"))
        ;
      else if(data->state.httpreq == HTTPREQ_POST_FORM &&
              /* this header (extended by formdata.c) is sent later */
              Curl_str_casecompare(&name, "Content-Type"))
        ;
      else if(data->state.httpreq == HTTPREQ_POST_MIME &&
              /* this header is sent later */
              Curl_str_casecompare(&name, "Content-Type"))
        ;
      else if(data->req.authneg &&
              /* while doing auth neg, do not allow the custom length since
                 we will force length zero then */
              Curl_str_casecompare(&name, "Content-Length"))
        ;
      else if(data->state.aptr.te &&
              /* when asking for Transfer-Encoding, do not pass on a custom
                 Connection: */
              Curl_str_casecompare(&name, "Connection"))
        ;
      else if((httpversion >= 20) &&
              Curl_str_casecompare(&name, "Transfer-Encoding"))
        /* HTTP/2 does not support chunked requests */
        ;
      else if((Curl_str_casecompare(&name, "Authorization") ||
               Curl_str_casecompare(&name, "Cookie")) &&
              /* be careful of sending this potentially sensitive header to
                 other hosts */
              !Curl_auth_allowed_to_host(data))
        ;
      else if(blankheader)
        result = Curl_dyn_addf(req, "%.*s:\r\n", (int)Curl_strlen(&name),
                               Curl_str(&name));
      else
        result = Curl_dyn_addf(req, "%s\r\n", origp);

      if(result)
        return result;
    }
  }

  return CURLE_OK;
}